

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O2

int s98c_register_device(s98c *ctx,char *dev_name,uint32_t clock,uint8_t panpot)

{
  uint32_t uVar1;
  int iVar2;
  s98deviceinfo *psVar3;
  ulong uVar4;
  size_t sVar5;
  
  if ((ctx->header).version == -1) {
    fwrite("error: Cannot define #device without #version\n",0x2e,1,_stderr);
    iVar2 = 1;
  }
  else {
    uVar1 = s98c_find_device(dev_name);
    if (uVar1 == 0xffffffff) {
      fprintf(_stderr,"error: Undefined device name: %s\n",dev_name);
      iVar2 = 2;
    }
    else {
      uVar4 = (ulong)(ctx->header).device_count;
      if (uVar4 < ctx->dev_count) {
        psVar3 = ctx->devices;
      }
      else {
        sVar5 = ctx->dev_count + 4;
        ctx->dev_count = sVar5;
        psVar3 = (s98deviceinfo *)realloc(ctx->devices,sVar5 * 0x10);
        ctx->devices = psVar3;
        uVar4 = (ulong)(ctx->header).device_count;
      }
      (ctx->header).device_count = (int)uVar4 + 1;
      psVar3[uVar4].device = uVar1;
      psVar3[uVar4].clock = clock;
      psVar3[uVar4].panpot = (uint)panpot;
      psVar3[uVar4].reserved = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int s98c_register_device(struct s98c* ctx, char* dev_name, uint32_t clock, uint8_t panpot)
{
    if(ctx->header.version == -1) {
        fprintf(stderr, "error: Cannot define #device without #version\n");
        return 1;
    }
    {
        struct s98deviceinfo info;

        info.device = s98c_find_device(dev_name);
        if(info.device == -1) {
            fprintf(stderr, "error: Undefined device name: %s\n", dev_name);
            return 2;
        }
        info.clock = clock;
        info.panpot = panpot;
        info.reserved = 0;

        if(ctx->header.device_count >= ctx->dev_count) {
            ctx->dev_count += INITIAL_DEVICES;
            ctx->devices = realloc(ctx->devices, ctx->dev_count * sizeof(struct s98deviceinfo));
        }

        ctx->devices[ctx->header.device_count++] = info;
    }
    return 0;
}